

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O3

int worker_wait_idle(worker_handle *wh)

{
  mutex_handle *mutex;
  void *pvVar1;
  uint uVar2;
  int iVar3;
  
  pvVar1 = wh->priv;
  mutex = (mutex_handle *)((long)pvVar1 + 0x10);
  mutex_lock(mutex);
  uVar2 = *(uint *)((long)pvVar1 + 0x38);
  iVar3 = 0;
  if (uVar2 < 5) {
    do {
      if (uVar2 < 3) {
        iVar3 = -0x16;
        break;
      }
      condvar_wait((condvar_handle *)((long)pvVar1 + 8),mutex);
      uVar2 = *(uint *)((long)pvVar1 + 0x38);
      iVar3 = 0;
    } while (uVar2 < 5);
  }
  mutex_unlock(mutex);
  return iVar3;
}

Assistant:

int worker_wait_idle(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;
	int ret = 0;

	mutex_lock(&priv->mutex);

	while (priv->state < WORKER_IDLE) {
		if (priv->state < WORKER_BUSY) {
			ret = -EINVAL;
			break;
		}

		condvar_wait(&priv->condvar_idle, &priv->mutex);
	}

	mutex_unlock(&priv->mutex);

	return ret;
}